

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

CATNNode<wchar_t> * __thiscall
Centaurus::CompositeATN<wchar_t>::operator[](CompositeATN<wchar_t> *this,ATNPath *path)

{
  int index;
  Identifier *__k;
  mapped_type *this_00;
  CATNNode<wchar_t> *pCVar1;
  ATNPath *path_local;
  CompositeATN<wchar_t> *this_local;
  
  __k = ATNPath::leaf_id(path);
  this_00 = std::
            unordered_map<Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>_>_>
            ::at(&this->m_dict,__k);
  index = ATNPath::leaf_index(path);
  pCVar1 = CATNMachine<wchar_t>::operator[](this_00,index);
  return pCVar1;
}

Assistant:

const CATNNode<TCHAR>& operator[](const ATNPath& path) const
    {
        return m_dict.at(path.leaf_id())[path.leaf_index()];
    }